

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-val.c
# Opt level: O0

wchar_t borg_lookup_kind(wchar_t tval,wchar_t sval)

{
  char *pcVar1;
  object_kind *k_ptr;
  wchar_t k;
  wchar_t sval_local;
  wchar_t tval_local;
  
  k_ptr._0_4_ = L'\x01';
  while( true ) {
    if ((int)(uint)z_info->k_max <= (wchar_t)k_ptr) {
      pcVar1 = tval_find_name(tval);
      msg("No object (%s,%d,%d)",pcVar1,(ulong)(uint)tval,(ulong)(uint)sval);
      return L'\0';
    }
    if ((k_info[(wchar_t)k_ptr].tval == tval) && (k_info[(wchar_t)k_ptr].sval == sval)) break;
    k_ptr._0_4_ = (wchar_t)k_ptr + L'\x01';
  }
  return (wchar_t)k_ptr;
}

Assistant:

int borg_lookup_kind(int tval, int sval)
{
    int k;

    /* Look for it */
    for (k = 1; k < z_info->k_max; k++) {
        struct object_kind *k_ptr = &k_info[k];

        /* Found a match */
        if ((k_ptr->tval == tval) && (k_ptr->sval == sval))
            return (k);
    }

    /* Failure */
    msg("No object (%s,%d,%d)", tval_find_name(tval), tval, sval);
    return 0;
}